

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O0

PHYSFS_Io * SZIP_openRead(void *opaque,char *path)

{
  SRes rc_00;
  PHYSFS_ErrorCode PVar1;
  void *pvVar2;
  PHYSFS_Io *pPVar3;
  void *pvStack_40d0;
  SRes rc;
  void *buf;
  size_t outSizeProcessed;
  size_t offset;
  size_t outBufferSize;
  Byte *outBuffer;
  PHYSFS_Io *pPStack_40a0;
  UInt32 blockIndex;
  PHYSFS_Io *io;
  PHYSFS_Io *retval;
  SZIPLookToRead stream;
  ISzAlloc *alloc;
  SZIPentry *entry;
  SZIPinfo *info;
  char *path_local;
  void *opaque_local;
  
  pvVar2 = __PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,path);
  stream.lookStream.buf._16376_8_ = &SZIP_SzAlloc;
  io = (PHYSFS_Io *)0x0;
  pPStack_40a0 = (PHYSFS_Io *)0x0;
  outBuffer._4_4_ = 0xffffffff;
  outBufferSize = 0;
  offset = 0;
  outSizeProcessed = 0;
  buf = (void *)0x0;
  pvStack_40d0 = (void *)0x0;
  if (pvVar2 != (void *)0x0) {
    if (*(int *)((long)pvVar2 + 0x20) == 0) {
      pPStack_40a0 = (PHYSFS_Io *)
                     (**(code **)(*(long *)((long)opaque + 0x20) + 0x38))
                               (*(undefined8 *)((long)opaque + 0x20));
      if (pPStack_40a0 != (PHYSFS_Io *)0x0) {
        szipInitStream((SZIPLookToRead *)&retval,pPStack_40a0);
        rc_00 = SzArEx_Extract((CSzArEx *)((long)opaque + 0x28),(ILookInStream *)&stream.io,
                               *(UInt32 *)((long)pvVar2 + 0x28),(UInt32 *)((long)&outBuffer + 4),
                               (Byte **)&outBufferSize,&offset,&outSizeProcessed,(size_t *)&buf,
                               (ISzAlloc *)stream.lookStream.buf._16376_8_,
                               (ISzAlloc *)stream.lookStream.buf._16376_8_);
        if (rc_00 == 0) {
          (*pPStack_40a0->destroy)(pPStack_40a0);
          pPStack_40a0 = (PHYSFS_Io *)0x0;
          pvStack_40d0 = (*__PHYSFS_AllocatorHooks.Malloc)((PHYSFS_uint64)buf);
          memcpy(pvStack_40d0,(void *)(outBufferSize + outSizeProcessed),(size_t)buf);
          (**(code **)(stream.lookStream.buf._16376_8_ + 8))
                    (stream.lookStream.buf._16376_8_,outBufferSize);
          outBufferSize = 0;
          pPVar3 = __PHYSFS_createMemoryIo
                             (pvStack_40d0,(PHYSFS_uint64)buf,__PHYSFS_AllocatorHooks.Free);
          if (pPVar3 != (PHYSFS_Io *)0x0) {
            return pPVar3;
          }
          io = (PHYSFS_Io *)0x0;
        }
        else {
          PVar1 = szipErrorCode(rc_00);
          if (PVar1 != PHYSFS_ERR_OK) {
            PVar1 = szipErrorCode(rc_00);
            PHYSFS_setErrorCode(PVar1);
          }
        }
      }
      if (pPStack_40a0 != (PHYSFS_Io *)0x0) {
        (*pPStack_40a0->destroy)(pPStack_40a0);
      }
      if (pvStack_40d0 != (void *)0x0) {
        (*__PHYSFS_AllocatorHooks.Free)(pvStack_40d0);
      }
      if (outBufferSize != 0) {
        (**(code **)(stream.lookStream.buf._16376_8_ + 8))
                  (stream.lookStream.buf._16376_8_,outBufferSize);
      }
    }
    else {
      PHYSFS_setErrorCode(PHYSFS_ERR_NOT_A_FILE);
    }
  }
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *SZIP_openRead(void *opaque, const char *path)
{
    /* !!! FIXME: the current lzma sdk C API only allows you to decompress
       !!! FIXME:  the entire file at once, which isn't ideal. Fix this in the
       !!! FIXME:  SDK and then convert this all to a streaming interface. */

    SZIPinfo *info = (SZIPinfo *) opaque;
    SZIPentry *entry = (SZIPentry *) __PHYSFS_DirTreeFind(&info->tree, path);
    ISzAlloc *alloc = &SZIP_SzAlloc;
    SZIPLookToRead stream;
    PHYSFS_Io *retval = NULL;
    PHYSFS_Io *io = NULL;
    UInt32 blockIndex = 0xFFFFFFFF;
    Byte *outBuffer = NULL;
    size_t outBufferSize = 0;
    size_t offset = 0;
    size_t outSizeProcessed = 0;
    void *buf = NULL;
    SRes rc;

    BAIL_IF_ERRPASS(!entry, NULL);
    BAIL_IF(entry->tree.isdir, PHYSFS_ERR_NOT_A_FILE, NULL);

    io = info->io->duplicate(info->io);
    GOTO_IF_ERRPASS(!io, SZIP_openRead_failed);

    szipInitStream(&stream, io);

    rc = SzArEx_Extract(&info->db, &stream.lookStream.s, entry->dbidx,
                        &blockIndex, &outBuffer, &outBufferSize, &offset,
                        &outSizeProcessed, alloc, alloc);
    GOTO_IF(rc != SZ_OK, szipErrorCode(rc), SZIP_openRead_failed);

    io->destroy(io);
    io = NULL;

    buf = allocator.Malloc(outSizeProcessed);
    GOTO_IF(rc != SZ_OK, PHYSFS_ERR_OUT_OF_MEMORY, SZIP_openRead_failed);
    memcpy(buf, outBuffer + offset, outSizeProcessed);

    alloc->Free(alloc, outBuffer);
    outBuffer = NULL;

    retval = __PHYSFS_createMemoryIo(buf, outSizeProcessed, allocator.Free);
    GOTO_IF_ERRPASS(!retval, SZIP_openRead_failed);

    return retval;

SZIP_openRead_failed:
    if (io != NULL)
        io->destroy(io);

    if (buf)
        allocator.Free(buf);

    if (outBuffer)
        alloc->Free(alloc, outBuffer);

    return NULL;
}